

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::InputTextureImage<3u>
          (StorageMultisampleTest *this,GLenum internal_format,GLuint width,GLuint height,
          GLuint depth,GLenum format,GLenum type,GLvoid *data)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 in_register_0000008c;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1320))
            (0x8c1a,0,internal_format,width,height,depth,0,CONCAT44(in_register_0000008c,format),
             type,data);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glTexImage2D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd13);
  return;
}

Assistant:

void StorageMultisampleTest::InputTextureImage<3>(const glw::GLenum internal_format, const glw::GLuint width,
												  const glw::GLuint height, const glw::GLuint depth,
												  const glw::GLenum format, const glw::GLenum type,
												  const glw::GLvoid* data)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Data setup. */
	gl.texImage3D(InputTextureTarget<3>(), 0, internal_format, width, height, depth, 0, format, type, data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");
}